

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS
ref_cavity_form_insert
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node,REF_INT site,REF_INT protect,
          REF_INT faceid)

{
  int iVar1;
  REF_CELL pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  uint uVar6;
  REF_STATUS RVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  REF_INT RVar12;
  int iVar13;
  bool bVar14;
  bool bVar15;
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [3];
  uint local_7c;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  REF_INT local_50;
  int local_4c [3];
  long local_40;
  REF_NODE local_38;
  
  local_38 = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node;
  iVar13 = local_38->ref_mpi->id;
  if ((iVar13 == local_38->part[node]) &&
     (local_40 = (long)site, iVar13 == local_38->part[local_40])) {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      pRVar2 = ref_grid->cell[3];
      uVar9 = 0xffffffff;
      if (-1 < site) {
        uVar9 = 0xffffffff;
        if (site < pRVar2->ref_adj->nnode) {
          uVar9 = (ulong)(uint)pRVar2->ref_adj->first[local_40];
        }
      }
      if ((int)uVar9 == -1) {
        local_7c = 0;
      }
      else {
        RVar12 = pRVar2->ref_adj->item[(int)uVar9].ref;
        local_7c = 0;
        do {
          iVar13 = pRVar2->node_per;
          if (iVar13 < 1) {
LAB_0015c9b6:
            if ((faceid == -1) ||
               (bVar15 = false, pRVar2->c2n[pRVar2->size_per * RVar12 + iVar13] == faceid)) {
              uVar6 = ref_list_contains(ref_cavity->tri_list,RVar12,&local_5c);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x39d,"ref_cavity_form_insert",(ulong)uVar6,"have tet?");
                local_7c = uVar6;
              }
              bVar15 = true;
              if (uVar6 == 0) {
                if (local_5c == 0) {
                  uVar6 = ref_list_push(ref_cavity->tri_list,RVar12);
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x39f,"ref_cavity_form_insert",(ulong)uVar6,"save tri");
                    local_7c = uVar6;
                  }
                  bVar15 = true;
                  if (uVar6 == 0) {
                    uVar6 = ref_cell_all_local(pRVar2,local_38,RVar12,&local_60);
                    if (uVar6 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x3a0,"ref_cavity_form_insert",(ulong)uVar6,"local cell");
                      local_7c = uVar6;
                    }
                    bVar15 = true;
                    if (uVar6 == 0) {
                      if (local_60 == 0) {
                        ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                        local_7c = 0;
                      }
                      else {
                        pRVar4 = pRVar2->c2n;
                        lVar8 = (long)RVar12;
                        lVar11 = pRVar2->size_per * lVar8;
                        local_50 = pRVar4[(long)(int)lVar11 + (long)pRVar2->node_per];
                        local_58 = pRVar4[lVar11 + 1];
                        local_54 = pRVar4[lVar11 + 2];
                        if ((local_54 == node || local_58 == node) ||
                           (uVar6 = ref_cavity_insert_seg(ref_cavity,&local_58), uVar6 == 0)) {
                          lVar11 = pRVar2->size_per * lVar8;
                          local_58 = pRVar2->c2n[lVar11 + 2];
                          local_54 = pRVar2->c2n[lVar11];
                          if (local_54 != node && local_58 != node) {
                            uVar6 = ref_cavity_insert_seg(ref_cavity,&local_58);
                            if (uVar6 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                     ,0x3b1,"ref_cavity_form_insert",(ulong)uVar6,"tri side");
                              local_7c = uVar6;
                            }
                            bVar15 = true;
                            if (uVar6 != 0) goto LAB_0015ca7d;
                          }
                          lVar8 = pRVar2->size_per * lVar8;
                          local_58 = pRVar2->c2n[lVar8];
                          local_54 = pRVar2->c2n[lVar8 + 1];
                          bVar15 = false;
                          if (local_54 != node && local_58 != node) {
                            uVar6 = ref_cavity_insert_seg(ref_cavity,&local_58);
                            if (uVar6 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                     ,0x3b7,"ref_cavity_form_insert",(ulong)uVar6,"tri side");
                              local_7c = uVar6;
                            }
                            bVar15 = uVar6 != 0;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0x3ab,"ref_cavity_form_insert",(ulong)uVar6,"tri side");
                          bVar15 = true;
                          local_7c = uVar6;
                        }
                      }
                    }
                  }
                }
                else {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x39e,"ref_cavity_form_insert");
                  bVar15 = true;
                  local_7c = 1;
                }
              }
            }
          }
          else {
            lVar8 = 0;
            bVar14 = false;
            do {
              bVar15 = !bVar14;
              bVar14 = true;
              if (bVar15) {
                bVar14 = pRVar2->c2n[(long)pRVar2->size_per * (long)RVar12 + lVar8] == protect;
              }
              lVar8 = lVar8 + 1;
            } while (iVar13 != (int)lVar8);
            bVar15 = false;
            if (!bVar14) goto LAB_0015c9b6;
          }
LAB_0015ca7d:
          if (bVar15) {
            return local_7c;
          }
          pRVar3 = pRVar2->ref_adj->item;
          iVar13 = pRVar3[(int)uVar9].next;
          uVar9 = (ulong)iVar13;
          if (uVar9 == 0xffffffffffffffff) {
            RVar12 = -1;
          }
          else {
            RVar12 = pRVar3[uVar9].ref;
          }
        } while (iVar13 != -1);
      }
      pRVar2 = ref_grid->cell[8];
      RVar12 = -1;
      uVar9 = 0xffffffff;
      if (-1 < site) {
        uVar9 = 0xffffffff;
        if (site < pRVar2->ref_adj->nnode) {
          uVar9 = (ulong)(uint)pRVar2->ref_adj->first[local_40];
        }
      }
      if ((int)uVar9 != -1) {
        RVar12 = pRVar2->ref_adj->item[(int)uVar9].ref;
      }
      while ((int)uVar9 != -1) {
        if (pRVar2->node_per < 1) {
LAB_0015cde5:
          uVar6 = ref_list_contains(ref_cavity->tet_list,RVar12,&local_5c);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x3c6,"ref_cavity_form_insert",(ulong)uVar6,"have tet?");
            local_7c = uVar6;
          }
          iVar13 = 1;
          if (uVar6 == 0) {
            if (local_5c == 0) {
              uVar6 = ref_list_push(ref_cavity->tet_list,RVar12);
              if (uVar6 == 0) {
                uVar6 = ref_cell_all_local(pRVar2,local_38,RVar12,&local_60);
                if (uVar6 == 0) {
                  if (local_60 == 0) {
                    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                    local_7c = 0;
                    iVar13 = 1;
                  }
                  else if (pRVar2->face_per < 1) {
                    iVar13 = 0;
                  }
                  else {
                    lVar8 = 0;
                    lVar11 = 0;
                    do {
                      pRVar4 = pRVar2->c2n;
                      iVar1 = pRVar2->size_per;
                      pRVar5 = pRVar2->f2n;
                      lVar10 = 0;
                      do {
                        local_4c[lVar10] =
                             pRVar4[(long)*(int *)((long)pRVar5 + lVar10 * 4 + lVar8) +
                                    (long)RVar12 * (long)iVar1];
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 3);
                      if ((((local_4c[0] != node) && (local_4c[1] != node)) && (local_4c[2] != node)
                          ) && (uVar6 = ref_cavity_insert_face(ref_cavity,local_4c), uVar6 != 0)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0x3d6,"ref_cavity_form_insert",(ulong)uVar6,"tet side");
                        local_7c = uVar6;
                        goto LAB_0015ce81;
                      }
                      lVar11 = lVar11 + 1;
                      lVar8 = lVar8 + 0x10;
                    } while (lVar11 < pRVar2->face_per);
                    iVar13 = 0;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x3c9,"ref_cavity_form_insert",(ulong)uVar6,"local cell");
                  local_7c = uVar6;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x3c8,"ref_cavity_form_insert",(ulong)uVar6,"save tet");
                local_7c = uVar6;
              }
            }
            else {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x3c7,"ref_cavity_form_insert");
              local_7c = 1;
              iVar13 = 1;
            }
          }
        }
        else {
          lVar8 = 0;
          bVar14 = false;
          do {
            bVar15 = !bVar14;
            bVar14 = true;
            if (bVar15) {
              bVar14 = pRVar2->c2n[(long)pRVar2->size_per * (long)RVar12 + lVar8] == protect;
            }
            lVar8 = lVar8 + 1;
          } while (pRVar2->node_per != (int)lVar8);
          iVar13 = 10;
          if (!bVar14) goto LAB_0015cde5;
        }
LAB_0015ce81:
        if ((iVar13 != 10) && (iVar13 != 0)) {
          return local_7c;
        }
        pRVar3 = pRVar2->ref_adj->item;
        uVar9 = (ulong)pRVar3[(int)uVar9].next;
        if (uVar9 == 0xffffffffffffffff) {
          RVar12 = -1;
        }
        else {
          RVar12 = pRVar3[uVar9].ref;
        }
      }
      if (ref_cavity->debug != 0) {
        printf("insert form state %d\n",(ulong)ref_cavity->state);
      }
      RVar7 = ref_cavity_verify_face_manifold(ref_cavity);
      if (RVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x3dd,"ref_cavity_form_insert",1,"ball face manifold");
        return 1;
      }
      if (ref_cavity->debug != 0) {
        printf("insert face manifold state %d\n",(ulong)ref_cavity->state);
      }
      RVar7 = ref_cavity_verify_seg_manifold(ref_cavity);
      if (RVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x3e1,"ref_cavity_form_insert",1,"ball seg manifold");
        return 1;
      }
      if (ref_cavity->debug != 0) {
        printf("insert seg manifold state %d\n",(ulong)ref_cavity->state);
        return 0;
      }
    }
    else {
      ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
    }
  }
  else {
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert(REF_CAVITY ref_cavity,
                                          REF_GRID ref_grid, REF_INT node,
                                          REF_INT site, REF_INT protect,
                                          REF_INT faceid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_face, face_node, cell;
  REF_BOOL has_node;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node) || !ref_node_owned(ref_node, site)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    /* only insert tri with faceid if not empty */
    if (REF_EMPTY != faceid &&
        faceid != ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell))
      continue;
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tri twice?");
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }

    seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node = (node == face_nodes[0] || node == face_nodes[1] ||
                  node == face_nodes[2]);
      if (!has_node) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  if (ref_cavity_debug(ref_cavity))
    printf("insert form state %d\n", (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert face manifold state %d\n",
           (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert seg manifold state %d\n", (int)ref_cavity_state(ref_cavity));

  return REF_SUCCESS;
}